

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O3

void getaddrinfo_cb(uv_getaddrinfo_t *req,int status,addrinfo *res)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  sockaddr_in *in_RCX;
  long extraout_RDX;
  undefined1 *extraout_RDX_00;
  uint uVar3;
  int iVar4;
  uv_getnameinfo_t *puVar5;
  uv_random_t *req_00;
  uv_getnameinfo_t *unaff_R14;
  long lVar6;
  long lVar7;
  uv_timer_t uStack_1f20;
  uv_work_t auStack_1e88 [16];
  uv_loop_t *puStack_1680;
  uv_random_t uStack_1650;
  undefined1 auStack_15c0 [24];
  sockaddr_in sStack_1590;
  uv_getnameinfo_t *puStack_1580;
  void *pvStack_1578;
  undefined1 auStack_1570 [1472];
  uv_getnameinfo_t uStack_fb0;
  uv_getnameinfo_t uStack_a88;
  uv_getnameinfo_t uStack_560;
  uv_loop_t *puStack_30;
  
  if (status == -0xbbb) {
    if (res == (addrinfo *)0x0) {
      uv_freeaddrinfo((addrinfo *)0x0);
      return;
    }
  }
  else {
    getaddrinfo_cb_cold_1();
  }
  getaddrinfo_cb_cold_2();
  if (((uv_loop_t *)((long)req + -0x350))->inotify_fd == 0) {
LAB_00173554:
    lVar6 = 0;
    uv_close((uv_handle_t *)req,(uv_close_cb)0x0);
    do {
      uv_sem_post((uv_sem_t *)((long)pause_sems + lVar6));
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x80);
    timer_cb_called = timer_cb_called + 1;
    return;
  }
  uVar3 = 0;
  while( true ) {
    iVar1 = uv_cancel((uv_req_t *)
                      ((ulong)(*(int *)&((uv_loop_t *)((long)req + -0x350))->field_0x34c * uVar3) +
                      (long)((uv_loop_t *)((long)req + -0x350))->inotify_watchers));
    if (iVar1 != 0) break;
    uVar3 = uVar3 + 1;
    if ((uint)((uv_loop_t *)((long)req + -0x350))->inotify_fd <= uVar3) goto LAB_00173554;
  }
  timer_cb_cold_1();
  iVar4 = 0x50;
  puStack_30 = (uv_loop_t *)req;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&sStack_1590);
  if (iVar1 == 0) {
    unaff_R14 = (uv_getnameinfo_t *)(auStack_1570 + 0x98);
    pvStack_1578 = (void *)0x52800000004;
    puStack_1580 = unaff_R14;
    req = (uv_getaddrinfo_t *)uv_default_loop();
    saturate_threadpool();
    in_RCX = &sStack_1590;
    puVar5 = unaff_R14;
    iVar1 = uv_getnameinfo((uv_loop_t *)req,unaff_R14,getnameinfo_cb,(sockaddr *)in_RCX,0);
    iVar4 = (int)puVar5;
    if (iVar1 != 0) goto LAB_00173705;
    puVar5 = &uStack_fb0;
    in_RCX = &sStack_1590;
    iVar1 = uv_getnameinfo((uv_loop_t *)req,puVar5,getnameinfo_cb,(sockaddr *)in_RCX,0);
    iVar4 = (int)puVar5;
    if (iVar1 != 0) goto LAB_0017370a;
    puVar5 = &uStack_a88;
    in_RCX = &sStack_1590;
    iVar1 = uv_getnameinfo((uv_loop_t *)req,puVar5,getnameinfo_cb,(sockaddr *)in_RCX,0);
    iVar4 = (int)puVar5;
    if (iVar1 != 0) goto LAB_0017370f;
    puVar5 = &uStack_560;
    in_RCX = &sStack_1590;
    iVar1 = uv_getnameinfo((uv_loop_t *)req,puVar5,getnameinfo_cb,(sockaddr *)in_RCX,0);
    iVar4 = (int)puVar5;
    if (iVar1 != 0) goto LAB_00173714;
    unaff_R14 = (uv_getnameinfo_t *)auStack_1570;
    puVar5 = unaff_R14;
    iVar1 = uv_timer_init((uv_loop_t *)req,(uv_timer_t *)unaff_R14);
    iVar4 = (int)puVar5;
    if (iVar1 != 0) goto LAB_00173719;
    iVar4 = 0x17352b;
    in_RCX = (sockaddr_in *)0x0;
    iVar1 = uv_timer_start((uv_timer_t *)unaff_R14,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_0017371e;
    iVar4 = 0;
    iVar1 = uv_run((uv_loop_t *)req,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00173723;
    if (timer_cb_called != 1) goto LAB_00173728;
    req = (uv_getaddrinfo_t *)uv_default_loop();
    uv_walk((uv_loop_t *)req,close_walk_cb,(void *)0x0);
    iVar4 = 0;
    uv_run((uv_loop_t *)req,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_threadpool_cancel_getnameinfo_cold_1();
LAB_00173705:
    run_test_threadpool_cancel_getnameinfo_cold_2();
LAB_0017370a:
    run_test_threadpool_cancel_getnameinfo_cold_3();
LAB_0017370f:
    run_test_threadpool_cancel_getnameinfo_cold_4();
LAB_00173714:
    run_test_threadpool_cancel_getnameinfo_cold_5();
LAB_00173719:
    run_test_threadpool_cancel_getnameinfo_cold_6();
LAB_0017371e:
    run_test_threadpool_cancel_getnameinfo_cold_7();
LAB_00173723:
    run_test_threadpool_cancel_getnameinfo_cold_8();
LAB_00173728:
    run_test_threadpool_cancel_getnameinfo_cold_9();
  }
  run_test_threadpool_cancel_getnameinfo_cold_10();
  if (iVar4 == -0xbbb) {
    if (extraout_RDX != 0) goto LAB_0017374c;
    if (in_RCX == (sockaddr_in *)0x0) {
      return;
    }
  }
  else {
    getnameinfo_cb_cold_1();
LAB_0017374c:
    getnameinfo_cb_cold_2();
  }
  getnameinfo_cb_cold_3();
  auStack_15c0._8_8_ = req;
  auStack_15c0._16_8_ = unaff_R14;
  saturate_threadpool();
  loop = uv_default_loop();
  req_00 = &uStack_1650;
  lVar6 = 1;
  puVar2 = loop;
  iVar1 = uv_random(loop,req_00,auStack_15c0,1,0,nop_random_cb);
  iVar4 = (int)req_00;
  if (iVar1 == 0) {
    puVar2 = (uv_loop_t *)&uStack_1650;
    iVar1 = uv_cancel((uv_req_t *)puVar2);
    if (iVar1 != 0) goto LAB_00173839;
    if (done_cb_called == 0) {
      lVar7 = 0;
      do {
        uv_sem_post((uv_sem_t *)((long)pause_sems + lVar7));
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x80);
      iVar4 = 0;
      puVar2 = loop;
      iVar1 = uv_run(loop,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        if (done_cb_called != 1) goto LAB_00173848;
        loop = uv_default_loop();
        uv_walk(loop,close_walk_cb,(void *)0x0);
        iVar4 = 0;
        uv_run(loop,UV_RUN_DEFAULT);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return;
        }
      }
      else {
LAB_00173843:
        run_test_threadpool_cancel_random_cold_4();
LAB_00173848:
        run_test_threadpool_cancel_random_cold_5();
      }
      run_test_threadpool_cancel_random_cold_6();
      if (iVar4 == -0x7d) {
        if ((undefined1 *)((long)&puVar2->wq_mutex + 8) != extraout_RDX_00) goto LAB_00173877;
        if (lVar6 == 1) {
          done_cb_called = done_cb_called + 1;
          return;
        }
      }
      else {
        nop_random_cb_cold_1();
LAB_00173877:
        nop_random_cb_cold_2();
      }
      nop_random_cb_cold_3();
      puStack_1680 = loop;
      puVar2 = uv_default_loop();
      saturate_threadpool();
      lVar6 = 0;
      do {
        iVar1 = uv_queue_work(puVar2,(uv_work_t *)((long)auStack_1e88[0].reserved + lVar6 + -0x10),
                              work2_cb,done2_cb);
        if (iVar1 != 0) {
          run_test_threadpool_cancel_work_cold_1();
LAB_00173993:
          run_test_threadpool_cancel_work_cold_2();
LAB_00173998:
          run_test_threadpool_cancel_work_cold_3();
LAB_0017399d:
          run_test_threadpool_cancel_work_cold_4();
LAB_001739a2:
          run_test_threadpool_cancel_work_cold_5();
          goto LAB_001739a7;
        }
        lVar6 = lVar6 + 0x80;
      } while (lVar6 != 0x800);
      iVar1 = uv_timer_init(puVar2,&uStack_1f20);
      if (iVar1 != 0) goto LAB_00173993;
      iVar1 = uv_timer_start(&uStack_1f20,timer_cb,10,0);
      if (iVar1 != 0) goto LAB_00173998;
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_0017399d;
      if (timer_cb_called != 1) goto LAB_001739a2;
      if (done2_cb_called == 0x10) {
        puVar2 = uv_default_loop();
        uv_walk(puVar2,close_walk_cb,(void *)0x0);
        uv_run(puVar2,UV_RUN_DEFAULT);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          return;
        }
        goto LAB_001739ac;
      }
LAB_001739a7:
      run_test_threadpool_cancel_work_cold_6();
LAB_001739ac:
      run_test_threadpool_cancel_work_cold_7();
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
              ,0x75,"0 && \"work2_cb called\"");
      abort();
    }
  }
  else {
    run_test_threadpool_cancel_random_cold_1();
LAB_00173839:
    run_test_threadpool_cancel_random_cold_2();
  }
  run_test_threadpool_cancel_random_cold_3();
  goto LAB_00173843;
}

Assistant:

static void getaddrinfo_cb(uv_getaddrinfo_t* handle,
                           int status,
                           struct addrinfo* res) {
  struct getaddrinfo_req* req;

  ASSERT(status == 0);

  req = container_of(handle, struct getaddrinfo_req, handle);
  uv_freeaddrinfo(res);

  if (--req->counter)
    getaddrinfo_do(req);
}